

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall soul::AST::Constant::Constant(Constant *this,Context *c,Value *v)

{
  SourceCodeText *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  BoundedIntSize BVar5;
  
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ASTObject_002d4778;
  (this->super_Expression).super_Statement.super_ASTObject.objectType = Constant;
  pSVar1 = (c->location).sourceCode.object;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object =
       pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  (this->super_Expression).super_Statement.super_ASTObject.context.location.location.data =
       (c->location).location.data;
  (this->super_Expression).super_Statement.super_ASTObject.context.parentScope = c->parentScope;
  (this->super_Expression).kind = value;
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__Constant_002d4bc8;
  CVar2 = (v->type).arrayElementCategory;
  bVar3 = (v->type).isRef;
  bVar4 = (v->type).isConstant;
  (this->value).type.category = (v->type).category;
  (this->value).type.arrayElementCategory = CVar2;
  (this->value).type.isRef = bVar3;
  (this->value).type.isConstant = bVar4;
  (this->value).type.primitiveType.type = (v->type).primitiveType.type;
  BVar5 = (v->type).arrayElementBoundingSize;
  (this->value).type.boundingSize = (v->type).boundingSize;
  (this->value).type.arrayElementBoundingSize = BVar5;
  (this->value).type.structure.object = (v->type).structure.object;
  (v->type).structure.object = (Structure *)0x0;
  (this->value).allocatedData.allocatedSize = (v->allocatedData).allocatedSize;
  ArrayWithPreallocation<unsigned_char,_8UL>::ArrayWithPreallocation
            (&(this->value).allocatedData.allocatedData,&(v->allocatedData).allocatedData);
  if ((this->value).type.category != invalid) {
    return;
  }
  throwInternalCompilerError("value.isValid()","Constant",0x695);
}

Assistant:

Constant (const Context& c, Value v)
            : Expression (ObjectType::Constant, c, ExpressionKind::value), value (std::move (v))
        {
            SOUL_ASSERT (value.isValid());
        }